

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O3

string * cmCTestTestHandler::FindExecutable
                   (string *__return_storage_ptr__,cmCTest *ctest,char *testCommand,
                   string *resultingConfig,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *extraPaths,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *failed)

{
  pointer pcVar1;
  string *psVar2;
  char *pcVar3;
  string *psVar4;
  bool bVar5;
  int iVar6;
  size_t sVar7;
  ostream *poVar8;
  ulong uVar9;
  pointer pbVar10;
  ulong uVar11;
  string filenameExtra;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  attempted;
  string filepath;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  attemptedConfigs;
  string filename;
  string tempPath;
  string localfilepath;
  undefined1 auStack_318 [8];
  cmCTest *local_310;
  string local_308;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2e8;
  string *local_2c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_2c0;
  long *local_2b8;
  long local_2a8 [2];
  string local_298;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_278;
  string local_258;
  string local_238;
  char *local_218;
  string *local_210;
  string local_208;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [8];
  pointer pbStack_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  local_2e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_278.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_278.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_278.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  local_238._M_string_length = 0;
  local_238.field_2._M_local_buf[0] = '\0';
  local_310 = ctest;
  local_2c8 = __return_storage_ptr__;
  local_2c0 = failed;
  std::__cxx11::string::string((string *)local_1a8,testCommand,(allocator *)&local_258);
  cmsys::SystemTools::GetFilenamePath(&local_298,(string *)local_1a8);
  if (local_1a8 != (undefined1  [8])local_198) {
    operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
  }
  std::__cxx11::string::string((string *)local_1a8,testCommand,(allocator *)&local_308);
  cmsys::SystemTools::GetFilenameName(&local_258,(string *)local_1a8);
  if (local_1a8 != (undefined1  [8])local_198) {
    operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
  }
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c8,local_298._M_dataplus._M_p,
             local_298._M_dataplus._M_p + local_298._M_string_length);
  local_210 = resultingConfig;
  AddConfigurations(local_310,&local_2e8,&local_278,&local_1c8,&local_258);
  local_218 = testCommand;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if (local_298._M_string_length == 0) {
LAB_002f6055:
    pbVar10 = (extraPaths->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if ((extraPaths->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish != pbVar10) {
      uVar9 = 0;
      uVar11 = 1;
      do {
        cmsys::SystemTools::GetFilenamePath((string *)local_1a8,pbVar10 + uVar9);
        cmsys::SystemTools::GetFilenameName
                  (&local_308,
                   (extraPaths->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + uVar9);
        local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_208,local_1a8,
                   (char *)((long)local_1a8 + (long)&pbStack_1a0->_M_dataplus));
        AddConfigurations(local_310,&local_2e8,&local_278,&local_208,&local_308);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._M_dataplus._M_p != &local_308.field_2) {
          operator_delete(local_308._M_dataplus._M_p,
                          CONCAT71(local_308.field_2._M_allocated_capacity._1_7_,
                                   local_308.field_2._M_local_buf[0]) + 1);
        }
        if (local_1a8 != (undefined1  [8])local_198) {
          operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
        }
        pbVar10 = (extraPaths->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        bVar5 = uVar11 < (ulong)((long)(extraPaths->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar10
                                >> 5);
        uVar9 = uVar11;
        uVar11 = (ulong)((int)uVar11 + 1);
      } while (bVar5);
    }
  }
  else if (*local_298._M_dataplus._M_p == '/') {
    std::__cxx11::string::substr((ulong)local_1a8,(ulong)&local_298);
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1e8,local_1a8,
               (char *)((long)local_1a8 + (long)&pbStack_1a0->_M_dataplus));
    AddConfigurations(local_310,&local_2e8,&local_278,&local_1e8,&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    if (local_1a8 != (undefined1  [8])local_198) {
      operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
    }
    if (local_298._M_string_length == 0) goto LAB_002f6055;
  }
  psVar4 = local_210;
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  local_308._M_string_length = 0;
  local_308.field_2._M_local_buf[0] = '\0';
  if (local_2e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_2e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
LAB_002f62c1:
    psVar2 = local_2c8;
    if (local_298._M_string_length == 0) {
      local_1a8 = (undefined1  [8])0x0;
      pbStack_1a0 = (pointer)0x0;
      local_198[0]._M_allocated_capacity = 0;
      cmsys::SystemTools::FindProgram
                (local_2c8,local_258._M_dataplus._M_p,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1a8,false);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1a8);
      iVar6 = std::__cxx11::string::compare((char *)psVar2);
      if (iVar6 != 0) {
        std::__cxx11::string::_M_replace((ulong)psVar4,0,(char *)psVar4->_M_string_length,0x66eafa);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._M_dataplus._M_p != &local_308.field_2) {
          operator_delete(local_308._M_dataplus._M_p,
                          CONCAT71(local_308.field_2._M_allocated_capacity._1_7_,
                                   local_308.field_2._M_local_buf[0]) + 1);
        }
        goto LAB_002f657f;
      }
      pcVar1 = (psVar2->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar1 != &psVar2->field_2) {
        operator_delete(pcVar1,(psVar2->field_2)._M_allocated_capacity + 1);
      }
      if (local_308._M_string_length != 0) goto LAB_002f6547;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Could not find executable ",0x1a);
    pcVar3 = local_218;
    if (local_218 == (char *)0x0) {
      std::ios::clear((int)auStack_318 + (int)*(undefined8 *)((long)local_1a8 + -0x18) + 0x170);
    }
    else {
      sVar7 = strlen(local_218);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar3,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Looked in the following places:\n",0x20);
    std::__cxx11::stringbuf::str();
    cmCTest::Log(local_310,2,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                 ,0x6bc,(char *)local_2b8,false);
    if (local_2b8 != local_2a8) {
      operator_delete(local_2b8,local_2a8[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    pbVar10 = (local_2c0->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if (pbVar10 !=
        (local_2c0->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      do {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(pbVar10->_M_dataplus)._M_p,
                            pbVar10->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
        std::__cxx11::stringbuf::str();
        cmCTest::Log(local_310,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                     ,0x6bf,(char *)local_2b8,false);
        if (local_2b8 != local_2a8) {
          operator_delete(local_2b8,local_2a8[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        pbVar10 = pbVar10 + 1;
      } while (pbVar10 !=
               (local_2c0->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  else {
    uVar9 = 0;
    uVar11 = 1;
    do {
      if (local_308._M_string_length != 0) goto LAB_002f6547;
      bVar5 = cmsys::SystemTools::FileExists
                        (local_2e8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar9]._M_dataplus._M_p);
      if ((!bVar5) ||
         (bVar5 = cmsys::SystemTools::FileIsDirectory
                            (local_2e8.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + uVar9), bVar5)) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(local_2c0,
                    local_2e8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar9);
        std::__cxx11::string::_M_assign((string *)&local_238);
        cmsys::SystemTools::GetExecutableExtension();
        std::__cxx11::string::append((char *)&local_238);
        bVar5 = cmsys::SystemTools::FileExists(local_238._M_dataplus._M_p);
        if ((bVar5) && (bVar5 = cmsys::SystemTools::FileIsDirectory(&local_238), !bVar5)) {
          cmsys::SystemTools::CollapseFullPath((string *)local_1a8,&local_238);
          goto LAB_002f6252;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(local_2c0,&local_238);
      }
      else {
        cmsys::SystemTools::CollapseFullPath
                  ((string *)local_1a8,
                   local_2e8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar9);
LAB_002f6252:
        std::__cxx11::string::operator=((string *)&local_308,(string *)local_1a8);
        if (local_1a8 != (undefined1  [8])local_198) {
          operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
        }
        std::__cxx11::string::_M_assign((string *)psVar4);
      }
      bVar5 = uVar11 < (ulong)((long)local_2e8.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_2e8.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5);
      uVar9 = uVar11;
      uVar11 = (ulong)((int)uVar11 + 1);
    } while (bVar5);
    if (local_308._M_string_length == 0) goto LAB_002f62c1;
  }
LAB_002f6547:
  (local_2c8->_M_dataplus)._M_p = (pointer)&local_2c8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p == &local_308.field_2) {
    (local_2c8->field_2)._M_allocated_capacity =
         CONCAT71(local_308.field_2._M_allocated_capacity._1_7_,local_308.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&local_2c8->field_2 + 8) = local_308.field_2._8_8_;
  }
  else {
    (local_2c8->_M_dataplus)._M_p = local_308._M_dataplus._M_p;
    (local_2c8->field_2)._M_allocated_capacity =
         CONCAT71(local_308.field_2._M_allocated_capacity._1_7_,local_308.field_2._M_local_buf[0]);
  }
  local_2c8->_M_string_length = local_308._M_string_length;
LAB_002f657f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,
                    CONCAT71(local_238.field_2._M_allocated_capacity._1_7_,
                             local_238.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_278);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2e8);
  return local_2c8;
}

Assistant:

std::string cmCTestTestHandler::FindExecutable(
  cmCTest* ctest, const char* testCommand, std::string& resultingConfig,
  std::vector<std::string>& extraPaths, std::vector<std::string>& failed)
{
  // now run the compiled test if we can find it
  std::vector<std::string> attempted;
  std::vector<std::string> attemptedConfigs;
  std::string tempPath;
  std::string filepath = cmSystemTools::GetFilenamePath(testCommand);
  std::string filename = cmSystemTools::GetFilenameName(testCommand);

  cmCTestTestHandler::AddConfigurations(ctest, attempted, attemptedConfigs,
                                        filepath, filename);

  // even if a fullpath was specified also try it relative to the current
  // directory
  if (!filepath.empty() && filepath[0] == '/') {
    std::string localfilepath = filepath.substr(1, filepath.size() - 1);
    cmCTestTestHandler::AddConfigurations(ctest, attempted, attemptedConfigs,
                                          localfilepath, filename);
  }

  // if extraPaths are provided and we were not passed a full path, try them,
  // try any extra paths
  if (filepath.empty()) {
    for (unsigned int i = 0; i < extraPaths.size(); ++i) {
      std::string filepathExtra =
        cmSystemTools::GetFilenamePath(extraPaths[i]);
      std::string filenameExtra =
        cmSystemTools::GetFilenameName(extraPaths[i]);
      cmCTestTestHandler::AddConfigurations(ctest, attempted, attemptedConfigs,
                                            filepathExtra, filenameExtra);
    }
  }

  // store the final location in fullPath
  std::string fullPath;

  // now look in the paths we specified above
  for (unsigned int ai = 0; ai < attempted.size() && fullPath.empty(); ++ai) {
    // first check without exe extension
    if (cmSystemTools::FileExists(attempted[ai].c_str()) &&
        !cmSystemTools::FileIsDirectory(attempted[ai])) {
      fullPath = cmSystemTools::CollapseFullPath(attempted[ai]);
      resultingConfig = attemptedConfigs[ai];
    }
    // then try with the exe extension
    else {
      failed.push_back(attempted[ai]);
      tempPath = attempted[ai];
      tempPath += cmSystemTools::GetExecutableExtension();
      if (cmSystemTools::FileExists(tempPath.c_str()) &&
          !cmSystemTools::FileIsDirectory(tempPath)) {
        fullPath = cmSystemTools::CollapseFullPath(tempPath);
        resultingConfig = attemptedConfigs[ai];
      } else {
        failed.push_back(tempPath);
      }
    }
  }

  // if everything else failed, check the users path, but only if a full path
  // wasn't specified
  if (fullPath.empty() && filepath.empty()) {
    std::string path = cmSystemTools::FindProgram(filename.c_str());
    if (path != "") {
      resultingConfig = "";
      return path;
    }
  }
  if (fullPath.empty()) {
    cmCTestLog(ctest, HANDLER_OUTPUT, "Could not find executable "
                 << testCommand << "\n"
                 << "Looked in the following places:\n");
    for (std::vector<std::string>::iterator i = failed.begin();
         i != failed.end(); ++i) {
      cmCTestLog(ctest, HANDLER_OUTPUT, *i << "\n");
    }
  }

  return fullPath;
}